

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

char * duckdb_snappy::internal::CompressFragment
                 (char *input,size_t input_size,char *op,uint16_t *table,int table_size)

{
  ulong *puVar1;
  ulong *puVar2;
  short sVar3;
  char cVar4;
  byte bVar5;
  uint32_t u;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong *puVar19;
  ulong *puVar20;
  ulong uVar21;
  long lVar22;
  ulong *puVar23;
  uint uVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong *puVar27;
  long lVar28;
  bool bVar29;
  
  puVar27 = (ulong *)(input + input_size);
  puVar23 = (ulong *)input;
  if (input_size < 0xf) {
LAB_001e7a41:
    if (puVar23 < puVar27) {
      iVar8 = (int)puVar27 - (int)puVar23;
      uVar14 = iVar8 - 1;
      if (iVar8 < 0x3d) {
        bVar5 = (char)uVar14 << 2;
        puVar27 = (ulong *)op;
      }
      else {
        uVar24 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        uVar24 = (uVar24 ^ 0x18) >> 3 ^ 3;
        *(uint *)((long)op + 1) = uVar14;
        bVar5 = (char)uVar24 * '\x04' | 0xf0;
        puVar27 = (ulong *)((long)op + (ulong)uVar24 + 1);
      }
      *op = bVar5;
      switchD_00b041bd::default((void *)((long)puVar27 + 1),puVar23,(long)iVar8);
      op = (char *)((long)puVar27 + (long)iVar8 + 1U);
    }
    return (char *)(ulong *)op;
  }
  uVar14 = table_size * 2 - 2;
  puVar1 = (ulong *)((long)puVar27 - 0xf);
  iVar8 = *(int *)(input + 1);
  puVar2 = puVar27 + -2;
LAB_001e75ad:
  puVar25 = (ulong *)((long)puVar23 + 1);
  uVar9 = *(ulong *)((long)puVar23 + 1);
  if ((long)puVar1 - (long)puVar25 < 0x10) {
    uVar12 = 0x21;
  }
  else {
    uVar24 = (1 - (int)input) + (int)puVar23 & 0xffff;
    lVar22 = 0;
    lVar18 = -1;
    lVar7 = -2;
    cVar10 = '\0';
    lVar15 = 0;
    do {
      lVar28 = 0;
      cVar4 = cVar10;
      do {
        iVar11 = (int)uVar9;
        if (lVar22 == lVar28) {
          iVar11 = iVar8;
        }
        uVar12 = (ulong)((uint)(iVar11 * 0x1e35a7bd) >> 0x10 & uVar14);
        uVar26 = (ulong)*(ushort *)(uVar12 + (long)table);
        *(short *)(uVar12 + (long)table) = (short)uVar24 + (short)lVar28;
        if (*(int *)(input + uVar26) == iVar11) {
          *op = cVar4;
          uVar12 = puVar23[1];
          *(ulong *)((long)op + 1) = *puVar23;
          *(ulong *)((long)op + 9) = uVar12;
          puVar25 = (ulong *)((long)puVar23 + (lVar28 - lVar18));
          op = (char *)((long)op + (lVar28 - lVar7));
          goto LAB_001e77a2;
        }
        uVar9 = uVar9 >> 8;
        lVar28 = lVar28 + 1;
        cVar4 = cVar4 + '\x04';
      } while (lVar28 != 4);
      uVar9 = *(ulong *)((long)puVar23 + lVar15 * 4 + 5);
      lVar15 = lVar15 + 1;
      cVar10 = cVar10 + '\x10';
      lVar7 = lVar7 + -4;
      lVar18 = lVar18 + -4;
      lVar22 = lVar22 + -4;
      uVar24 = uVar24 + 4;
    } while (lVar15 != 4);
    puVar25 = (ulong *)((long)puVar23 + 0x11);
    uVar12 = 0x31;
  }
  puVar20 = (ulong *)((long)puVar25 + 1);
  while( true ) {
    puVar19 = puVar20;
    if (puVar1 < puVar19) goto LAB_001e7a41;
    uVar21 = (ulong)((uint)((int)uVar9 * 0x1e35a7bd) >> 0x10 & uVar14);
    uVar26 = (ulong)*(ushort *)(uVar21 + (long)table);
    *(short *)(uVar21 + (long)table) = (short)puVar25 - (short)input;
    if (*(int *)(input + uVar26) == (int)uVar9) break;
    uVar9 = (ulong)(uint)*puVar19;
    uVar26 = uVar12 >> 5;
    uVar12 = (ulong)(uint)((int)uVar12 + (int)uVar26);
    puVar20 = (ulong *)(uVar26 + (long)puVar19);
    puVar25 = puVar19;
  }
  uVar24 = (int)puVar25 - (int)puVar23;
  uVar6 = uVar24 - 1;
  if ((int)uVar24 < 0x11) {
    *op = (char)uVar6 << 2;
    uVar12 = puVar23[1];
    *(ulong *)((long)op + 1) = *puVar23;
    *(ulong *)((long)op + 9) = uVar12;
    op = (char *)((long)op + (long)(int)uVar24 + 1);
  }
  else {
    if (uVar24 < 0x3d) {
      bVar5 = (char)uVar6 << 2;
      puVar20 = (ulong *)op;
    }
    else {
      uVar17 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar17 = (uVar17 ^ 0x18) >> 3 ^ 3;
      *(uint *)((long)op + 1) = uVar6;
      bVar5 = (char)uVar17 * '\x04' | 0xf0;
      puVar20 = (ulong *)((long)op + (ulong)uVar17 + 1);
    }
    *op = bVar5;
    op = (char *)((long)puVar20 + (ulong)(uVar24 & 0x7fffffff) + 1);
    puVar20 = (ulong *)((long)puVar20 + 1);
    do {
      uVar12 = puVar23[1];
      *puVar20 = *puVar23;
      puVar20[1] = uVar12;
      puVar20 = puVar20 + 2;
      puVar23 = puVar23 + 2;
    } while (puVar20 < op);
  }
LAB_001e77a2:
  pcVar13 = input + uVar26;
  puVar23 = (ulong *)((long)puVar25 + 4);
  if (puVar2 < puVar23) {
    uVar12 = 0;
LAB_001e788f:
    if (puVar23 <= puVar2) {
      lVar18 = uVar12 + 4;
LAB_001e78a1:
      lVar7 = lVar18;
      uVar12 = *puVar23;
      if (*(ulong *)(pcVar13 + lVar7) == uVar12) goto code_r0x001e78ae;
      uVar9 = *(ulong *)(pcVar13 + lVar7) ^ uVar12;
      uVar26 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
        }
      }
      if ((int)uVar9 == 0) {
        uVar12 = *(ulong *)((long)puVar23 + 4);
      }
      uVar9 = uVar12 >> ((byte)uVar26 & 0x18);
      uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar7;
      puVar23 = (ulong *)((long)puVar25 + uVar26);
      uVar21 = (long)puVar25 - (long)pcVar13;
      goto LAB_001e794b;
    }
    goto LAB_001e78bf;
  }
  uVar12 = *puVar23;
  if (*(ulong *)(pcVar13 + 4) == uVar12) {
    puVar23 = (ulong *)((long)puVar25 + 0xc);
    uVar12 = 8;
    goto LAB_001e788f;
  }
  uVar9 = *(ulong *)(pcVar13 + 4) ^ uVar12;
  uVar26 = 0;
  if (uVar9 != 0) {
    for (; (uVar9 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
    }
  }
  if ((int)uVar9 == 0) {
    uVar12 = puVar25[1];
  }
  uVar9 = uVar12 >> ((byte)uVar26 & 0x18);
  uVar26 = uVar26 >> 3 & 0x1fffffff;
  puVar23 = (ulong *)((long)puVar25 + uVar26 + 4);
  uVar26 = uVar26 + 4;
  uVar21 = (long)puVar25 - (long)pcVar13;
  goto LAB_001e77f5;
code_r0x001e78ae:
  puVar23 = puVar23 + 1;
  lVar18 = lVar7 + 8;
  if (puVar2 < puVar23) goto code_r0x001e78bb;
  goto LAB_001e78a1;
code_r0x001e78bb:
  uVar12 = lVar7 + 4;
LAB_001e78bf:
  uVar16 = uVar12;
  if (puVar23 < puVar27) {
    uVar16 = (long)puVar27 + (uVar12 - (long)puVar23);
    lVar18 = 0;
    do {
      if (pcVar13[lVar18 + uVar12 + 4] != *(char *)((long)puVar23 + lVar18)) {
        if ((ulong *)((long)puVar23 + lVar18) <= puVar27 + -1) {
          uVar9 = *(ulong *)((long)puVar23 + lVar18);
        }
        uVar21 = (long)puVar25 - (long)pcVar13;
        uVar26 = uVar12 + lVar18 + 4;
        puVar23 = (ulong *)((long)puVar25 + uVar12 + lVar18 + 4);
        if (7 < uVar12 + lVar18) goto LAB_001e794b;
        goto LAB_001e77f5;
      }
      lVar18 = lVar18 + 1;
    } while ((long)puVar27 - (long)puVar23 != lVar18);
  }
  uVar26 = uVar16 + 4;
  uVar21 = (long)puVar25 - (long)pcVar13;
  puVar23 = (ulong *)((long)puVar25 + uVar16 + 4);
  if (uVar16 < 8) {
LAB_001e77f5:
    bVar29 = uVar21 < 0x800;
    iVar8 = ((uint)(uVar21 >> 3) & 0xe0) - 0xf;
    if (!bVar29) {
      iVar8 = -2;
    }
    *(int *)op = iVar8 + (int)uVar21 * 0x100 + (int)uVar26 * 4;
  }
  else {
LAB_001e794b:
    iVar8 = (int)uVar21;
    if (0x43 < uVar26) {
      do {
        *(uint *)op = iVar8 << 8 | 0xfe;
        op = (char *)((long)op + 3);
        uVar26 = uVar26 - 0x40;
      } while (0x43 < uVar26);
    }
    if (uVar26 < 0x41) {
      if (0xb < uVar26) {
        *(int *)op = iVar8 * 0x100 + (int)uVar26 * 4 + -2;
        op = (char *)((long)op + 3);
        goto LAB_001e782e;
      }
    }
    else {
      *(uint *)op = iVar8 << 8 | 0xee;
      op = (char *)((long)op + 3);
      uVar26 = uVar26 - 0x3c;
    }
    bVar29 = uVar21 < 0x800;
    iVar11 = ((uint)(uVar21 >> 3) & 0xe0) - 0xf;
    if (!bVar29) {
      iVar11 = -2;
    }
    *(int *)op = iVar11 + iVar8 * 0x100 + (int)uVar26 * 4;
  }
  op = (char *)((long)op + (3 - (ulong)bVar29));
LAB_001e782e:
  if (puVar1 <= puVar23) goto LAB_001e7a41;
  sVar3 = (short)puVar23 - (short)input;
  *(short *)((ulong)((uint)(*(int *)((long)puVar23 + -1) * 0x1e35a7bd) >> 0x10 & uVar14) +
            (long)table) = sVar3 + -1;
  uVar12 = (ulong)((uint)((int)uVar9 * 0x1e35a7bd) >> 0x10 & uVar14);
  uVar26 = (ulong)*(ushort *)(uVar12 + (long)table);
  *(short *)(uVar12 + (long)table) = sVar3;
  puVar25 = puVar23;
  if (*(int *)(input + uVar26) != (int)uVar9) goto LAB_001e7a2b;
  goto LAB_001e77a2;
LAB_001e7a2b:
  iVar8 = (int)(uVar9 >> 8);
  goto LAB_001e75ad;
}

Assistant:

char* CompressFragment(const char* input, size_t input_size, char* op,
                       uint16_t* table, const int table_size) {
  // "ip" is the input pointer, and "op" is the output pointer.
  const char* ip = input;
  assert(input_size <= kBlockSize);
  assert((table_size & (table_size - 1)) == 0);  // table must be power of two
  const uint32_t mask = 2 * (table_size - 1);
  const char* ip_end = input + input_size;
  const char* base_ip = ip;

  const size_t kInputMarginBytes = 15;
  if (SNAPPY_PREDICT_TRUE(input_size >= kInputMarginBytes)) {
    const char* ip_limit = input + input_size - kInputMarginBytes;

    for (uint32_t preload = LittleEndian::Load32(ip + 1);;) {
      // Bytes in [next_emit, ip) will be emitted as literal bytes.  Or
      // [next_emit, ip_end) after the main loop.
      const char* next_emit = ip++;
      uint64_t data = LittleEndian::Load64(ip);
      // The body of this loop calls EmitLiteral once and then EmitCopy one or
      // more times.  (The exception is that when we're close to exhausting
      // the input we goto emit_remainder.)
      //
      // In the first iteration of this loop we're just starting, so
      // there's nothing to copy, so calling EmitLiteral once is
      // necessary.  And we only start a new iteration when the
      // current iteration has determined that a call to EmitLiteral will
      // precede the next call to EmitCopy (if any).
      //
      // Step 1: Scan forward in the input looking for a 4-byte-long match.
      // If we get close to exhausting the input then goto emit_remainder.
      //
      // Heuristic match skipping: If 32 bytes are scanned with no matches
      // found, start looking only at every other byte. If 32 more bytes are
      // scanned (or skipped), look at every third byte, etc.. When a match is
      // found, immediately go back to looking at every byte. This is a small
      // loss (~5% performance, ~0.1% density) for compressible data due to more
      // bookkeeping, but for non-compressible data (such as JPEG) it's a huge
      // win since the compressor quickly "realizes" the data is incompressible
      // and doesn't bother looking for matches everywhere.
      //
      // The "skip" variable keeps track of how many bytes there are since the
      // last match; dividing it by 32 (ie. right-shifting by five) gives the
      // number of bytes to move ahead for each iteration.
      uint32_t skip = 32;

      const char* candidate;
      if (ip_limit - ip >= 16) {
        auto delta = ip - base_ip;
        for (int j = 0; j < 4; ++j) {
          for (int k = 0; k < 4; ++k) {
            int i = 4 * j + k;
            // These for-loops are meant to be unrolled. So we can freely
            // special case the first iteration to use the value already
            // loaded in preload.
            uint32_t dword = i == 0 ? preload : static_cast<uint32_t>(data);
            assert(dword == LittleEndian::Load32(ip + i));
            uint16_t* table_entry = TableEntry(table, dword, mask);
            candidate = base_ip + *table_entry;
            assert(candidate >= base_ip);
            assert(candidate < ip + i);
            *table_entry = delta + i;
            if (SNAPPY_PREDICT_FALSE(LittleEndian::Load32(candidate) == dword)) {
              *op = LITERAL | (i << 2);
              UnalignedCopy128(next_emit, op + 1);
              ip += i;
              op = op + i + 2;
              goto emit_match;
            }
            data >>= 8;
          }
          data = LittleEndian::Load64(ip + 4 * j + 4);
        }
        ip += 16;
        skip += 16;
      }
      while (true) {
        assert(static_cast<uint32_t>(data) == LittleEndian::Load32(ip));
        uint16_t* table_entry = TableEntry(table, data, mask);
        uint32_t bytes_between_hash_lookups = skip >> 5;
        skip += bytes_between_hash_lookups;
        const char* next_ip = ip + bytes_between_hash_lookups;
        if (SNAPPY_PREDICT_FALSE(next_ip > ip_limit)) {
          ip = next_emit;
          goto emit_remainder;
        }
        candidate = base_ip + *table_entry;
        assert(candidate >= base_ip);
        assert(candidate < ip);

        *table_entry = ip - base_ip;
        if (SNAPPY_PREDICT_FALSE(static_cast<uint32_t>(data) ==
                                LittleEndian::Load32(candidate))) {
          break;
        }
        data = LittleEndian::Load32(next_ip);
        ip = next_ip;
      }

      // Step 2: A 4-byte match has been found.  We'll later see if more
      // than 4 bytes match.  But, prior to the match, input
      // bytes [next_emit, ip) are unmatched.  Emit them as "literal bytes."
      assert(next_emit + 16 <= ip_end);
      op = EmitLiteral</*allow_fast_path=*/true>(op, next_emit, ip - next_emit);

      // Step 3: Call EmitCopy, and then see if another EmitCopy could
      // be our next move.  Repeat until we find no match for the
      // input immediately after what was consumed by the last EmitCopy call.
      //
      // If we exit this loop normally then we need to call EmitLiteral next,
      // though we don't yet know how big the literal will be.  We handle that
      // by proceeding to the next iteration of the main loop.  We also can exit
      // this loop via goto if we get close to exhausting the input.
    emit_match:
      do {
        // We have a 4-byte match at ip, and no need to emit any
        // "literal bytes" prior to ip.
        const char* base = ip;
        std::pair<size_t, bool> p =
            FindMatchLength(candidate + 4, ip + 4, ip_end, &data);
        size_t matched = 4 + p.first;
        ip += matched;
        size_t offset = base - candidate;
        assert(0 == memcmp(base, candidate, matched));
        if (p.second) {
          op = EmitCopy</*len_less_than_12=*/true>(op, offset, matched);
        } else {
          op = EmitCopy</*len_less_than_12=*/false>(op, offset, matched);
        }
        if (SNAPPY_PREDICT_FALSE(ip >= ip_limit)) {
          goto emit_remainder;
        }
        // Expect 5 bytes to match
        assert((data & 0xFFFFFFFFFF) ==
               (LittleEndian::Load64(ip) & 0xFFFFFFFFFF));
        // We are now looking for a 4-byte match again.  We read
        // table[Hash(ip, mask)] for that.  To improve compression,
        // we also update table[Hash(ip - 1, mask)] and table[Hash(ip, mask)].
        *TableEntry(table, LittleEndian::Load32(ip - 1), mask) =
            ip - base_ip - 1;
        uint16_t* table_entry = TableEntry(table, data, mask);
        candidate = base_ip + *table_entry;
        *table_entry = ip - base_ip;
        // Measurements on the benchmarks have shown the following probabilities
        // for the loop to exit (ie. avg. number of iterations is reciprocal).
        // BM_Flat/6  txt1    p = 0.3-0.4
        // BM_Flat/7  txt2    p = 0.35
        // BM_Flat/8  txt3    p = 0.3-0.4
        // BM_Flat/9  txt3    p = 0.34-0.4
        // BM_Flat/10 pb      p = 0.4
        // BM_Flat/11 gaviota p = 0.1
        // BM_Flat/12 cp      p = 0.5
        // BM_Flat/13 c       p = 0.3
      } while (static_cast<uint32_t>(data) == LittleEndian::Load32(candidate));
      // Because the least significant 5 bytes matched, we can utilize data
      // for the next iteration.
      preload = data >> 8;
    }
  }

emit_remainder:
  // Emit the remaining bytes as a literal
  if (ip < ip_end) {
    op = EmitLiteral</*allow_fast_path=*/false>(op, ip, ip_end - ip);
  }

  return op;
}